

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int aead_decrypt_1rtt(void *ctx,uint64_t pn,quicly_decoded_packet_t *packet,size_t aead_off,
                     size_t *ptlen)

{
  long lVar1;
  uint64_t newly_decrypted_key_phase;
  uint uVar2;
  int iVar3;
  long lVar4;
  ptls_cipher_suite_t *cipher;
  size_t sVar5;
  ptls_aead_context_t **aead;
  ptls_aead_context_t *aead_00;
  
  lVar1 = *(long *)((long)ctx + 0x540);
  uVar2 = *(packet->octets).base >> 2 & 1;
  aead = (ptls_aead_context_t **)(lVar1 + (ulong)uVar2 * 8 + 0x58);
  aead_00 = *aead;
  lVar4 = lVar1;
  if (aead_00 != (ptls_aead_context_t *)0x0) goto LAB_0011b518;
  while( true ) {
    if (*(ptls_cipher_context_t **)(lVar4 + 0x48) != (ptls_cipher_context_t *)0x0) {
      ptls_cipher_free(*(ptls_cipher_context_t **)(lVar4 + 0x48));
      *(undefined8 *)(*(long *)((long)ctx + 0x540) + 0x48) = 0;
    }
    cipher = ptls_get_cipher(*(ptls_t **)((long)ctx + 0x8b0));
    iVar3 = update_1rtt_key((quicly_conn_t *)ctx,cipher,0,aead,(uint8_t *)(lVar1 + 0x68));
    if (iVar3 != 0) {
      return iVar3;
    }
    *(long *)(lVar1 + 0xa8) = *(long *)(lVar1 + 0xa8) + 1;
    aead_00 = *aead;
LAB_0011b518:
    sVar5 = aead_decrypt_core(aead_00,pn,packet,aead_off);
    *ptlen = sVar5;
    if (sVar5 != 0xffffffffffffffff) {
      newly_decrypted_key_phase = *(uint64_t *)(lVar1 + 0xa8);
      if (((newly_decrypted_key_phase != *(uint64_t *)(lVar1 + 0xb0)) &&
          (((uint)newly_decrypted_key_phase & 1) == uVar2)) &&
         (iVar3 = received_key_update((quicly_conn_t *)ctx,newly_decrypted_key_phase), iVar3 != 0))
      {
        return iVar3;
      }
      return 0;
    }
    if (*(long *)(lVar1 + 0xb0) != *(long *)(lVar1 + 0xa8)) {
      return 0xff01;
    }
    if (((uint)*(long *)(lVar1 + 0xb0) & 1) == uVar2) break;
    aead_decrypt_core(aead_00,pn,packet,aead_off);
    lVar4 = *(long *)((long)ctx + 0x540);
  }
  return 0xff01;
}

Assistant:

static int aead_decrypt_1rtt(void *ctx, uint64_t pn, quicly_decoded_packet_t *packet, size_t aead_off, size_t *ptlen)
{
    quicly_conn_t *conn = ctx;
    struct st_quicly_application_space_t *space = conn->application;
    size_t aead_index = (packet->octets.base[0] & QUICLY_KEY_PHASE_BIT) != 0;
    int ret;

    /* prepare key, when not available (yet) */
    if (space->cipher.ingress.aead[aead_index] == NULL) {
    Retry_1RTT : {
        /* Replace the AEAD key at the alternative slot (note: decryption key slots are shared by 0-RTT and 1-RTT), at the same time
         * dropping 0-RTT header protection key. */
        if (conn->application->cipher.ingress.header_protection.zero_rtt != NULL) {
            ptls_cipher_free(conn->application->cipher.ingress.header_protection.zero_rtt);
            conn->application->cipher.ingress.header_protection.zero_rtt = NULL;
        }
        ptls_cipher_suite_t *cipher = ptls_get_cipher(conn->crypto.tls);
        if ((ret = update_1rtt_key(conn, cipher, 0, &space->cipher.ingress.aead[aead_index], space->cipher.ingress.secret)) != 0)
            return ret;
        ++space->cipher.ingress.key_phase.prepared;
        QUICLY_PROBE(CRYPTO_RECEIVE_KEY_UPDATE_PREPARE, conn, conn->stash.now, space->cipher.ingress.key_phase.prepared,
                     QUICLY_PROBE_HEXDUMP(space->cipher.ingress.secret, cipher->hash->digest_size));
    }
    }

    /* decrypt */
    ptls_aead_context_t *aead = space->cipher.ingress.aead[aead_index];
    if ((*ptlen = aead_decrypt_core(aead, pn, packet, aead_off)) == SIZE_MAX) {
        /* retry with a new key, if possible */
        if (space->cipher.ingress.key_phase.decrypted == space->cipher.ingress.key_phase.prepared &&
            space->cipher.ingress.key_phase.decrypted % 2 != aead_index) {
            /* reapply AEAD to revert payload to the encrypted form. This assumes that the cipher used in AEAD is CTR. */
            aead_decrypt_core(aead, pn, packet, aead_off);
            goto Retry_1RTT;
        }
        /* otherwise return failure */
        return QUICLY_ERROR_PACKET_IGNORED;
    }

    /* update the confirmed key phase and also the egress key phase, if necessary */
    if (space->cipher.ingress.key_phase.prepared != space->cipher.ingress.key_phase.decrypted &&
        space->cipher.ingress.key_phase.prepared % 2 == aead_index) {
        if ((ret = received_key_update(conn, space->cipher.ingress.key_phase.prepared)) != 0)
            return ret;
    }

    return 0;
}